

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::PrecisionCase::PrecisionCase
          (PrecisionCase *this,CaseContext *context,string *name,string *extension)

{
  TestContext *testCtx;
  char *pcVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *extension_local;
  string *name_local;
  CaseContext *context_local;
  PrecisionCase *this_local;
  
  testCtx = context->testContext;
  local_28 = extension;
  extension_local = name;
  name_local = &context->name;
  context_local = (CaseContext *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar1,&local_49);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PrecisionCase_016b7900;
  CaseContext::CaseContext(&this->m_ctx,(CaseContext *)name_local);
  std::__cxx11::string::string((string *)&this->m_extension,(string *)local_28);
  ShaderSpec::ShaderSpec(&this->m_spec);
  return;
}

Assistant:

PrecisionCase	(const CaseContext& context, const string& name, const string& extension = "")
							: TestCase		(context.testContext, name.c_str(), name.c_str())
							, m_ctx			(context)
							, m_extension	(extension)
							{
							}